

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void __thiscall CMainParams::CMainParams(CMainParams *this)

{
  map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  *this_00;
  uint256 *puVar1;
  CBlock *this_01;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  _Rb_tree_header *p_Var3;
  pointer puVar4;
  void *pvVar5;
  base_blob<256U> *pbVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  undefined1 *puVar11;
  long lVar12;
  undefined1 *puVar13;
  CBlock *pCVar14;
  CBlock *pCVar15;
  CAmount *in_R9;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_241;
  undefined8 local_240;
  CBlock local_238 [4];
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  local_58;
  long local_20;
  
  bVar16 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = MAIN;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar4 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  this_00 = &(this->super_CChainParams).consensus.script_flag_exceptions;
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0x22;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0x9c;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0x4f;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0xac;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xba;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0x94;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xeb;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\b';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xf1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0xa5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '(';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xcc;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x8d;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xed;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '#';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x97;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xf4;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf4;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xeb;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'n';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 'u';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 0xdc;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\x02'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_58._M_impl._0_4_ = 0;
  std::
  map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::emplace<uint256,__0>
            ((map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_238,(anon_enum_32 *)&local_58);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0xad;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0x95;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0xe3;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0xa1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '^';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xe5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xff;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xd5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x85;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xc5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe8;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\x1d';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'D';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xb5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 'j';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x98;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x1e';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0x84;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '-';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '[';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xc3;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\x14'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\x0f'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_58._M_impl._0_4_ = 0x801;
  std::
  _Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::_M_emplace_unique<uint256,unsigned_int>
            ((_Rb_tree<uint256,std::pair<uint256_const,unsigned_int>,std::_Select1st<std::pair<uint256_const,unsigned_int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)this_00,(uint256 *)local_238,(uint *)&local_58);
  (this->super_CChainParams).consensus.BIP34Height = 0x37a5b;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xb8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x9c;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'u';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'j';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xdd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x15';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0x91;
  (pbVar6->m_data)._M_elems[9] = 0xb1;
  (pbVar6->m_data)._M_elems[10] = 0xd1;
  (pbVar6->m_data)._M_elems[0xb] = '{';
  (pbVar6->m_data)._M_elems[0xc] = 0xab;
  (pbVar6->m_data)._M_elems[0xd] = 'D';
  (pbVar6->m_data)._M_elems[0xe] = 0xbb;
  (pbVar6->m_data)._M_elems[0xf] = 0xa3;
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xfe;
  (pbVar6->m_data)._M_elems[0x11] = 0xd9;
  (pbVar6->m_data)._M_elems[0x12] = 0xe0;
  (pbVar6->m_data)._M_elems[0x13] = '/';
  (pbVar6->m_data)._M_elems[0x14] = 0x94;
  (pbVar6->m_data)._M_elems[0x15] = '*';
  (pbVar6->m_data)._M_elems[0x16] = 0xb4;
  (pbVar6->m_data)._M_elems[0x17] = 0x89;
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  (this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       '\x02';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 0x5ed1d;
  (this->super_CChainParams).consensus.BIP66Height = 0x58ccd;
  (this->super_CChainParams).consensus.CSVHeight = 0x66600;
  (this->super_CChainParams).consensus.SegwitHeight = 0x75a20;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0x76200;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[4] = 0xff;
  (pbVar6->m_data)._M_elems[5] = 0xff;
  (pbVar6->m_data)._M_elems[6] = 0xff;
  (pbVar6->m_data)._M_elems[7] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0xff;
  (pbVar6->m_data)._M_elems[9] = 0xff;
  (pbVar6->m_data)._M_elems[10] = 0xff;
  (pbVar6->m_data)._M_elems[0xb] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = 0xff;
  (pbVar6->m_data)._M_elems[0xd] = 0xff;
  (pbVar6->m_data)._M_elems[0xe] = 0xff;
  (pbVar6->m_data)._M_elems[0xf] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = 0xff;
  (pbVar6->m_data)._M_elems[0xd] = 0xff;
  (pbVar6->m_data)._M_elems[0xe] = 0xff;
  (pbVar6->m_data)._M_elems[0xf] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xff;
  (pbVar6->m_data)._M_elems[0x11] = 0xff;
  (pbVar6->m_data)._M_elems[0x12] = 0xff;
  (pbVar6->m_data)._M_elems[0x13] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x14] = 0xff;
  (pbVar6->m_data)._M_elems[0x15] = 0xff;
  (pbVar6->m_data)._M_elems[0x16] = 0xff;
  (pbVar6->m_data)._M_elems[0x17] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x18] = 0xff;
  (pbVar6->m_data)._M_elems[0x19] = 0xff;
  (pbVar6->m_data)._M_elems[0x1a] = 0xff;
  (pbVar6->m_data)._M_elems[0x1b] = 0xff;
  pbVar6 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = false;
  (this->super_CChainParams).consensus.enforce_BIP94 = false;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x717;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = 0x60835f80;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x61131300;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0xad400;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xd6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 'D';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xec;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x93;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xc1;
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x0e';
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 0xb7;
  (pbVar6->m_data)._M_elems[9] = 0x86;
  (pbVar6->m_data)._M_elems[10] = 0xe1;
  (pbVar6->m_data)._M_elems[0xb] = 0x88;
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '?';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '&';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'W';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\x1a';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'O';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xef;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xca;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0x9a;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = 'X';
  (pbVar6->m_data)._M_elems[9] = 'W';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = 0xce;
  (pbVar6->m_data)._M_elems[0xc] = 0x97;
  (pbVar6->m_data)._M_elems[0xd] = '[';
  (pbVar6->m_data)._M_elems[0xe] = 0xd2;
  (pbVar6->m_data)._M_elems[0xf] = 0xe5;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = 0xdb;
  (pbVar6->m_data)._M_elems[0x11] = '[';
  (pbVar6->m_data)._M_elems[0x12] = '6';
  (pbVar6->m_data)._M_elems[0x13] = 0x90;
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x14] = 'X';
  (pbVar6->m_data)._M_elems[0x15] = '\x1c';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x16] = '\x01';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x1f] = '\0';
  pbVar6 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0xd9b4bef9;
  (this->super_CChainParams).nDefaultPort = 0x208d;
  (this->super_CChainParams).nPruneAfterHeight = 100000;
  (this->super_CChainParams).m_assumed_blockchain_size = 0x26c;
  (this->super_CChainParams).m_assumed_chain_state_size = 0xe;
  local_240 = 5000000000;
  CreateGenesisBlock(local_238,0x495fab29,0x7c2bac1d,0x1d00ffff,(int32_t)&local_240,in_R9);
  this_01 = &(this->super_CChainParams).genesis;
  pCVar14 = local_238;
  pCVar15 = this_01;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    uVar7 = (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0];
    uVar8 = (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1];
    uVar9 = (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2];
    uVar10 = (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3];
    (pCVar15->super_CBlockHeader).nVersion = (pCVar14->super_CBlockHeader).nVersion;
    (pCVar15->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = uVar7;
    (pCVar15->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = uVar8;
    (pCVar15->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = uVar9;
    (pCVar15->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = uVar10;
    pCVar14 = (CBlock *)((long)pCVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    pCVar15 = (CBlock *)((long)pCVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  pvVar2 = &(this->super_CChainParams).genesis.vtx;
  local_58._M_impl._0_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_58._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_238[0].vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_238[0].vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_238[0].vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238[0].vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238[0].vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238[0].vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_58);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_238[0].m_checked_merkle_root;
  (this->super_CChainParams).genesis.fChecked = local_238[0].fChecked;
  (this->super_CChainParams).genesis.m_checked_witness_commitment =
       local_238[0].m_checked_witness_commitment;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_238[0].vtx);
  CBlockHeader::GetHash((uint256 *)local_238,&this_01->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x13],CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                m_data._M_elems[0x12],
                                CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                         super_base_blob<256U>.m_data._M_elems[0x11],
                                         CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                  super_base_blob<256U>.m_data._M_elems[0x10],
                                                  CONCAT13(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xf],
                                                           CONCAT12(local_238[0].super_CBlockHeader.
                                                                    hashPrevBlock.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0xe],
                                                                    CONCAT11(local_238[0].
                                                                             super_CBlockHeader.
                                                                             hashPrevBlock.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0xd],
                                                                             local_238[0].
                                                                             super_CBlockHeader.
                                                                             hashPrevBlock.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0xc])))
                                                 ))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x1b],CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                m_data._M_elems[0x1a],
                                CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                         super_base_blob<256U>.m_data._M_elems[0x19],
                                         CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                  super_base_blob<256U>.m_data._M_elems[0x18],
                                                  CONCAT13(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0x17],
                                                           CONCAT12(local_238[0].super_CBlockHeader.
                                                                    hashPrevBlock.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x16],
                                                                    CONCAT11(local_238[0].
                                                                             super_CBlockHeader.
                                                                             hashPrevBlock.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x15],
                                                                             local_238[0].
                                                                             super_CBlockHeader.
                                                                             hashPrevBlock.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x14]))
                                                          )))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [3],CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                             m_data._M_elems[2],
                             CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                      super_base_blob<256U>.m_data._M_elems[1],
                                      CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock.
                                               super_base_blob<256U>.m_data._M_elems[0],
                                               CONCAT13(local_238[0].super_CBlockHeader.nVersion.
                                                        _3_1_,CONCAT12(local_238[0].
                                                                       super_CBlockHeader.nVersion.
                                                                       _2_1_,CONCAT11(local_238[0].
                                                                                                                                                                            
                                                  super_CBlockHeader.nVersion._1_1_,
                                                  (undefined1)
                                                  local_238[0].super_CBlockHeader.nVersion)))))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0xb],CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                               m_data._M_elems[10],
                               CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                        super_base_blob<256U>.m_data._M_elems[9],
                                        CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                 super_base_blob<256U>.m_data._M_elems[8],
                                                 CONCAT13(local_238[0].super_CBlockHeader.
                                                          hashPrevBlock.super_base_blob<256U>.m_data
                                                          ._M_elems[7],
                                                          CONCAT12(local_238[0].super_CBlockHeader.
                                                                   hashPrevBlock.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[6],
                                                                   CONCAT11(local_238[0].
                                                                            super_CBlockHeader.
                                                                            hashPrevBlock.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[5],
                                                                            local_238[0].
                                                                            super_CBlockHeader.
                                                                            hashPrevBlock.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[4]))))))
               );
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0x6f;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0xe2;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0x8c;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 10;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xb6;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xf1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb3;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 'r';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xc1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xa6;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xa2;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 'F';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xae;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'c';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xf7;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 'O';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x93;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\x1e';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x83;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 'e';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xe1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 'Z';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\b';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 0x9c;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 'h';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xd6;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\x19'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  auVar18[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == 0x93);
  auVar18[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == '\x1e');
  auVar18[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 0x83);
  auVar18[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == 'e');
  auVar18[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == 0xe1);
  auVar18[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == 'Z');
  auVar18[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == '\b');
  auVar18[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == 0x9c);
  auVar18[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 'h');
  auVar18[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xd6);
  auVar18[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == '\x19');
  auVar18[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == '\0');
  auVar18[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\0');
  auVar18[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar18[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar18[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar17[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 'o');
  auVar17[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == 0xe2);
  auVar17[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 0x8c);
  auVar17[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == '\n');
  auVar17[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 0xb6);
  auVar17[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == 0xf1);
  auVar17[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0xb3);
  auVar17[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == 'r');
  auVar17[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 0xc1);
  auVar17[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == 0xa6);
  auVar17[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 0xa2);
  auVar17[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == 'F');
  auVar17[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 0xae);
  auVar17[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 'c');
  auVar17[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == 0xf7);
  auVar17[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 'O');
  auVar18 = auVar18 & auVar17;
  if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8b,"CMainParams::CMainParams()");
  }
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0x3b;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0xa3;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0xed;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0xfd;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '{';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\x12';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xb2;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 'z';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 199;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = ',';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '>';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'g';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'v';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0x8f;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 'a';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x7f';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 200;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x1b';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xc3;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0x88;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0x8a;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'Q';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '2';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = ':';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0x9f;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0xb8;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xaa;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\x1e'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '^';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 'J';
  auVar20[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                '\x7f');
  auVar20[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                200);
  auVar20[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                '\x1b');
  auVar20[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xc3);
  auVar20[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                0x88);
  auVar20[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                0x8a);
  auVar20[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                'Q');
  auVar20[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                '2');
  auVar20[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                ':');
  auVar20[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                0x9f);
  auVar20[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 0xb8);
  auVar20[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  0xaa);
  auVar20[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  'K');
  auVar20[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  '\x1e');
  auVar20[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  '^');
  auVar20[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'J');
  auVar19[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == ';');
  auVar19[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == 0xa3)
  ;
  auVar19[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == 0xed)
  ;
  auVar19[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0xfd)
  ;
  auVar19[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == 'z');
  auVar19[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == '{');
  auVar19[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x12');
  auVar19[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0xb2)
  ;
  auVar19[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 'z');
  auVar19[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) == 199);
  auVar19[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) == ','
                 );
  auVar19[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  '>');
  auVar19[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  'g');
  auVar19[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  'v');
  auVar19[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  0x8f);
  auVar19[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  'a');
  auVar19 = auVar19 & auVar20;
  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8c,"CMainParams::CMainParams()");
  }
  this_02 = &(this->super_CChainParams).vSeeds;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.sipa.be.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [21])"dnsseed.bluematt.me.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[45]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [45])"dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [31])0x8905bc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [24])"seed.btc.petertodd.net.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [27])"seed.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [17])"dnsseed.emzy.de.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [22])"seed.bitcoin.wiz.biz.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
             (char (*) [29])"seed.mainnet.achownodes.xyz.");
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  puVar11 = (undefined1 *)operator_new(1);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = SUB81(puVar11,0);
  local_238[0].super_CBlockHeader.nVersion._1_1_ = (undefined1)((ulong)puVar11 >> 8);
  local_238[0].super_CBlockHeader.nVersion._2_1_ = (undefined1)((ulong)puVar11 >> 0x10);
  local_238[0].super_CBlockHeader.nVersion._3_1_ = (undefined1)((ulong)puVar11 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)((ulong)puVar11 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
       (uchar)((ulong)puVar11 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
       (uchar)((ulong)puVar11 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
       (uchar)((ulong)puVar11 >> 0x38);
  puVar13 = puVar11 + 1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] =
       (uchar)puVar13;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] =
       (uchar)((ulong)puVar13 >> 8);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] =
       (uchar)((ulong)puVar13 >> 0x10);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] =
       (uchar)((ulong)puVar13 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)((ulong)puVar13 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
       (uchar)((ulong)puVar13 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
       (uchar)((ulong)puVar13 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
       (uchar)((ulong)puVar13 >> 0x38);
  *puVar11 = 0;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,local_238);
  pvVar5 = (void *)CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                            m_data._M_elems[3],
                            CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                     super_base_blob<256U>.m_data._M_elems[2],
                                     CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                              super_base_blob<256U>.m_data._M_elems[1],
                                              CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock
                                                       .super_base_blob<256U>.m_data._M_elems[0],
                                                       CONCAT13(local_238[0].super_CBlockHeader.
                                                                nVersion._3_1_,
                                                                CONCAT12(local_238[0].
                                                                         super_CBlockHeader.nVersion
                                                                         ._2_1_,CONCAT11(local_238[0
                                                  ].super_CBlockHeader.nVersion._1_1_,
                                                  (undefined1)
                                                  local_238[0].super_CBlockHeader.nVersion)))))));
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.
                                    super_base_blob<256U>.m_data._M_elems[0x13],
                                    CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                             super_base_blob<256U>.m_data._M_elems[0x12],
                                             CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                      super_base_blob<256U>.m_data._M_elems[0x11],
                                                      CONCAT14(local_238[0].super_CBlockHeader.
                                                               hashPrevBlock.super_base_blob<256U>.
                                                               m_data._M_elems[0x10],
                                                               CONCAT13(local_238[0].
                                                                        super_CBlockHeader.
                                                                        hashPrevBlock.
                                                                        super_base_blob<256U>.m_data
                                                                        ._M_elems[0xf],
                                                                        CONCAT12(local_238[0].
                                                                                 super_CBlockHeader.
                                                                                 hashPrevBlock.
                                                                                                                                                                  
                                                  super_base_blob<256U>.m_data._M_elems[0xe],
                                                  CONCAT11(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xd],
                                                           local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xc]))))))) -
                           (long)pvVar5);
  }
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  puVar11 = (undefined1 *)operator_new(1);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = SUB81(puVar11,0);
  local_238[0].super_CBlockHeader.nVersion._1_1_ = (undefined1)((ulong)puVar11 >> 8);
  local_238[0].super_CBlockHeader.nVersion._2_1_ = (undefined1)((ulong)puVar11 >> 0x10);
  local_238[0].super_CBlockHeader.nVersion._3_1_ = (undefined1)((ulong)puVar11 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)((ulong)puVar11 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
       (uchar)((ulong)puVar11 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
       (uchar)((ulong)puVar11 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
       (uchar)((ulong)puVar11 >> 0x38);
  puVar13 = puVar11 + 1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] =
       (uchar)puVar13;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] =
       (uchar)((ulong)puVar13 >> 8);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] =
       (uchar)((ulong)puVar13 >> 0x10);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] =
       (uchar)((ulong)puVar13 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)((ulong)puVar13 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
       (uchar)((ulong)puVar13 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
       (uchar)((ulong)puVar13 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
       (uchar)((ulong)puVar13 >> 0x38);
  *puVar11 = 5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,local_238);
  pvVar5 = (void *)CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                            m_data._M_elems[3],
                            CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                     super_base_blob<256U>.m_data._M_elems[2],
                                     CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                              super_base_blob<256U>.m_data._M_elems[1],
                                              CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock
                                                       .super_base_blob<256U>.m_data._M_elems[0],
                                                       CONCAT13(local_238[0].super_CBlockHeader.
                                                                nVersion._3_1_,
                                                                CONCAT12(local_238[0].
                                                                         super_CBlockHeader.nVersion
                                                                         ._2_1_,CONCAT11(local_238[0
                                                  ].super_CBlockHeader.nVersion._1_1_,
                                                  (undefined1)
                                                  local_238[0].super_CBlockHeader.nVersion)))))));
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.
                                    super_base_blob<256U>.m_data._M_elems[0x13],
                                    CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                             super_base_blob<256U>.m_data._M_elems[0x12],
                                             CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                      super_base_blob<256U>.m_data._M_elems[0x11],
                                                      CONCAT14(local_238[0].super_CBlockHeader.
                                                               hashPrevBlock.super_base_blob<256U>.
                                                               m_data._M_elems[0x10],
                                                               CONCAT13(local_238[0].
                                                                        super_CBlockHeader.
                                                                        hashPrevBlock.
                                                                        super_base_blob<256U>.m_data
                                                                        ._M_elems[0xf],
                                                                        CONCAT12(local_238[0].
                                                                                 super_CBlockHeader.
                                                                                 hashPrevBlock.
                                                                                                                                                                  
                                                  super_base_blob<256U>.m_data._M_elems[0xe],
                                                  CONCAT11(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xd],
                                                           local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xc]))))))) -
                           (long)pvVar5);
  }
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  puVar11 = (undefined1 *)operator_new(1);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = SUB81(puVar11,0);
  local_238[0].super_CBlockHeader.nVersion._1_1_ = (undefined1)((ulong)puVar11 >> 8);
  local_238[0].super_CBlockHeader.nVersion._2_1_ = (undefined1)((ulong)puVar11 >> 0x10);
  local_238[0].super_CBlockHeader.nVersion._3_1_ = (undefined1)((ulong)puVar11 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)((ulong)puVar11 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
       (uchar)((ulong)puVar11 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
       (uchar)((ulong)puVar11 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
       (uchar)((ulong)puVar11 >> 0x38);
  puVar13 = puVar11 + 1;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] =
       (uchar)puVar13;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] =
       (uchar)((ulong)puVar13 >> 8);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] =
       (uchar)((ulong)puVar13 >> 0x10);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] =
       (uchar)((ulong)puVar13 >> 0x18);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)((ulong)puVar13 >> 0x20);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
       (uchar)((ulong)puVar13 >> 0x28);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
       (uchar)((ulong)puVar13 >> 0x30);
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
       (uchar)((ulong)puVar13 >> 0x38);
  *puVar11 = 0x80;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12];
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,local_238);
  pvVar5 = (void *)CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                            m_data._M_elems[3],
                            CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                     super_base_blob<256U>.m_data._M_elems[2],
                                     CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                              super_base_blob<256U>.m_data._M_elems[1],
                                              CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock
                                                       .super_base_blob<256U>.m_data._M_elems[0],
                                                       CONCAT13(local_238[0].super_CBlockHeader.
                                                                nVersion._3_1_,
                                                                CONCAT12(local_238[0].
                                                                         super_CBlockHeader.nVersion
                                                                         ._2_1_,CONCAT11(local_238[0
                                                  ].super_CBlockHeader.nVersion._1_1_,
                                                  (undefined1)
                                                  local_238[0].super_CBlockHeader.nVersion)))))));
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.
                                    super_base_blob<256U>.m_data._M_elems[0x13],
                                    CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                             super_base_blob<256U>.m_data._M_elems[0x12],
                                             CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                      super_base_blob<256U>.m_data._M_elems[0x11],
                                                      CONCAT14(local_238[0].super_CBlockHeader.
                                                               hashPrevBlock.super_base_blob<256U>.
                                                               m_data._M_elems[0x10],
                                                               CONCAT13(local_238[0].
                                                                        super_CBlockHeader.
                                                                        hashPrevBlock.
                                                                        super_base_blob<256U>.m_data
                                                                        ._M_elems[0xf],
                                                                        CONCAT12(local_238[0].
                                                                                 super_CBlockHeader.
                                                                                 hashPrevBlock.
                                                                                                                                                                  
                                                  super_base_blob<256U>.m_data._M_elems[0xe],
                                                  CONCAT11(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xd],
                                                           local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xc]))))))) -
                           (long)pvVar5);
  }
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 4;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0x88;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0xb2;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0x1e;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_238);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 4;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0x88;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0xad;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0xe4;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"bc",2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_238,chainparams_seed_main,
             "g+",(allocator_type *)&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->super_CChainParams).vFixedSeeds,local_238);
  pvVar5 = (void *)CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                            m_data._M_elems[3],
                            CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                     super_base_blob<256U>.m_data._M_elems[2],
                                     CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                              super_base_blob<256U>.m_data._M_elems[1],
                                              CONCAT14(local_238[0].super_CBlockHeader.hashPrevBlock
                                                       .super_base_blob<256U>.m_data._M_elems[0],
                                                       CONCAT13(local_238[0].super_CBlockHeader.
                                                                nVersion._3_1_,
                                                                CONCAT12(local_238[0].
                                                                         super_CBlockHeader.nVersion
                                                                         ._2_1_,CONCAT11(local_238[0
                                                  ].super_CBlockHeader.nVersion._1_1_,
                                                  (undefined1)
                                                  local_238[0].super_CBlockHeader.nVersion)))))));
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_238[0].super_CBlockHeader.hashPrevBlock.
                                    super_base_blob<256U>.m_data._M_elems[0x13],
                                    CONCAT16(local_238[0].super_CBlockHeader.hashPrevBlock.
                                             super_base_blob<256U>.m_data._M_elems[0x12],
                                             CONCAT15(local_238[0].super_CBlockHeader.hashPrevBlock.
                                                      super_base_blob<256U>.m_data._M_elems[0x11],
                                                      CONCAT14(local_238[0].super_CBlockHeader.
                                                               hashPrevBlock.super_base_blob<256U>.
                                                               m_data._M_elems[0x10],
                                                               CONCAT13(local_238[0].
                                                                        super_CBlockHeader.
                                                                        hashPrevBlock.
                                                                        super_base_blob<256U>.m_data
                                                                        ._M_elems[0xf],
                                                                        CONCAT12(local_238[0].
                                                                                 super_CBlockHeader.
                                                                                 hashPrevBlock.
                                                                                                                                                                  
                                                  super_base_blob<256U>.m_data._M_elems[0xe],
                                                  CONCAT11(local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xd],
                                                           local_238[0].super_CBlockHeader.
                                                           hashPrevBlock.super_base_blob<256U>.
                                                           m_data._M_elems[0xc]))))))) -
                           (long)pvVar5);
  }
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  memcpy(local_238,&DAT_0089d140,0x1d4);
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_238;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             &local_58,__l,(less<int> *)&local_240,&local_241);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &local_58._M_impl.super__Rb_tree_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_58._M_impl.super__Rb_tree_header._M_header._M_color;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) =
         local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) =
         local_58._M_impl.super__Rb_tree_header._M_header._M_right;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    &(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_58._M_impl.super__Rb_tree_header._M_node_count;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree(&local_58);
  local_238[0].super_CBlockHeader.nVersion._0_1_ = 0x40;
  local_238[0].super_CBlockHeader.nVersion._1_1_ = 0xd1;
  local_238[0].super_CBlockHeader.nVersion._2_1_ = 0xc;
  local_238[0].super_CBlockHeader.nVersion._3_1_ = 0;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0x96;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0x8f;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 'v';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\x10';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 's';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 'h';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 'w';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0x8f;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = ' ';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0x82;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '#';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x9e;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x7f';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 'Q';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x1a';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\x17';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xb7;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xab;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 0xcc;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 0x8e;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '^';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0x8e;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0x81;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 'g';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '_';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0xb6;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 'Z';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\x1b'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\x1b'
  ;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = 'R';
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xa5;
  local_238[0].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xa2;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = 0x82;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = 0xf3;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\x11';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = ';';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = 0xa5;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = 0x83;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = 0xda;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\x1c'
  ;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '?';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = 0xf2;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = 0x9b;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = 'h';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = 'r';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = 'H';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = 0xff;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = 's';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = 'x';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\"';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf8;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xce;
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = 'H';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\'';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
       '\x03';
  local_238[0].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = ':';
  local_238[0].super_CBlockHeader.nTime._0_2_ = 0x2028;
  local_238[0].super_CBlockHeader.nTime._2_1_ = 3;
  local_238[0].super_CBlockHeader._71_8_ = 0;
  local_238[0].super_CBlockHeader.nNonce._3_1_ = 0;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_238);
  (this->super_CChainParams).chainTxData.nTime = 0x66bccc78;
  (this->super_CChainParams).chainTxData.tx_count = 0x3f23d4b5;
  (this->super_CChainParams).chainTxData.dTxRate = 6.721086701157182;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CMainParams() {
        m_chain_type = ChainType::MAIN;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000000002dc756eebf4f49723ed8d30cc28a5f108eb94b1ba88ac4f9c22"}, SCRIPT_VERIFY_NONE);
        consensus.script_flag_exceptions.emplace( // Taproot exception
            uint256{"0000000000000000000f14c35b2d841e986ab5441de8c585d5ffe55ea1e395ad"}, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS);
        consensus.BIP34Height = 227931;
        consensus.BIP34Hash = uint256{"000000000000024b89b42a942fe0d9fea3bb44ab7bd1b19115dd6a759c0808b8"};
        consensus.BIP65Height = 388381; // 000000000000000004c2b624ed5d7756c508d90fd0da2c7c679febfa6c4735f0
        consensus.BIP66Height = 363725; // 00000000000000000379eaa19dce8c9b722d46ae6a57c2f1a988119488b50931
        consensus.CSVHeight = 419328; // 000000000000000004a1b34462cb8aeebd5799177f7a29cf28f2d1961716b5b5
        consensus.SegwitHeight = 481824; // 0000000000000000001c8018d9cb3b742ef25114f27563e3fc4a1902167f9893
        consensus.MinBIP9WarningHeight = 483840; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 709632; // Approximately November 12th, 2021

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000088e186b70e0862c193ec44d6"};
        consensus.defaultAssumeValid = uint256{"000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f"}; // 856760

        /**
         * The message start string is designed to be unlikely to occur in normal data.
         * The characters are rarely used upper ASCII, not valid as UTF-8, and produce
         * a large 32-bit integer with any alignment.
         */
        pchMessageStart[0] = 0xf9;
        pchMessageStart[1] = 0xbe;
        pchMessageStart[2] = 0xb4;
        pchMessageStart[3] = 0xd9;
        nDefaultPort = 8333;
        nPruneAfterHeight = 100000;
        m_assumed_blockchain_size = 620;
        m_assumed_chain_state_size = 14;

        genesis = CreateGenesisBlock(1231006505, 2083236893, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        // Note that of those which support the service bits prefix, most only support a subset of
        // possible options.
        // This is fine at runtime as we'll fall back to using them as an addrfetch if they don't support the
        // service bits we want, but we should get them updated to support all service bits wanted by any
        // release ASAP to avoid it where possible.
        vSeeds.emplace_back("seed.bitcoin.sipa.be."); // Pieter Wuille, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("dnsseed.bluematt.me."); // Matt Corallo, only supports x9
        vSeeds.emplace_back("dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us."); // Luke Dashjr
        vSeeds.emplace_back("seed.bitcoin.jonasschnelli.ch."); // Jonas Schnelli, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.btc.petertodd.net."); // Peter Todd, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("dnsseed.emzy.de."); // Stephan Oeste
        vSeeds.emplace_back("seed.bitcoin.wiz.biz."); // Jason Maurice
        vSeeds.emplace_back("seed.mainnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,0);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,5);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,128);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x88, 0xB2, 0x1E};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x88, 0xAD, 0xE4};

        bech32_hrp = "bc";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_main), std::end(chainparams_seed_main));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                { 11111, uint256{"0000000069e244f73d78e8fd29ba2fd2ed618bd6fa2ee92559f542fdb26e7c1d"}},
                { 33333, uint256{"000000002dd5588a74784eaa7ab0507a18ad16a236e7b1ce69f00d7ddfb5d0a6"}},
                { 74000, uint256{"0000000000573993a3c9e41ce34471c079dcf5f52a0e824a81e7f953b8661a20"}},
                {105000, uint256{"00000000000291ce28027faea320c8d2b054b2e0fe44a773f3eefb151d6bdc97"}},
                {134444, uint256{"00000000000005b12ffd4cd315cd34ffd4a594f430ac814c91184a0d42d2b0fe"}},
                {168000, uint256{"000000000000099e61ea72015e79632f216fe6cb33d7899acb35b75c8303b763"}},
                {193000, uint256{"000000000000059f452a5f7340de6682a977387c17010ff6e6c3bd83ca8b1317"}},
                {210000, uint256{"000000000000048b95347e83192f69cf0366076336c639f9b7228e9ba171342e"}},
                {216116, uint256{"00000000000001b4f4b433e81ee46494af945cf96014816a4e2370f11b23df4e"}},
                {225430, uint256{"00000000000001c108384350f74090433e7fcf79a606b8e797f065b130575932"}},
                {250000, uint256{"000000000000003887df1f29024b06fc2200b55f8af8f35453d7be294df2d214"}},
                {279000, uint256{"0000000000000001ae8c72a0b0c301f67e3afca10e819efa9041e458e9bd7e40"}},
                {295000, uint256{"00000000000000004d9b4ef50f0f9d686fd69db2e03af35a100370c64632a983"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 840'000,
                .hash_serialized = AssumeutxoHash{uint256{"a2a5521b1b5ab65f67818e5e8eccabb7171a517f9e2382208f77687310768f96"}},
                .m_chain_tx_count = 991032194,
                .blockhash = consteval_ctor(uint256{"0000000000000000000320283a032748cef8227873ff4872689bf23f1cda83a5"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f
            .nTime    = 1723649144,
            .tx_count = 1059312821,
            .dTxRate  = 6.721086701157182,
        };
    }